

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

double crnlib::image_utils::compute_ssim(image_u8 *a,image_u8 *b,int channel_index)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  double dVar5;
  double ssim;
  uint local_a0;
  uint ix;
  uint iy;
  uint x;
  uint y;
  uint total_blocks;
  double total_ssim;
  uint8 sy [36];
  uint8 local_58 [8];
  uint8 sx [36];
  uint N;
  int channel_index_local;
  image_u8 *b_local;
  image_u8 *a_local;
  
  _y = 0.0;
  x = 0;
  for (iy = 0; uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(a), iy < uVar2;
      iy = iy + 6) {
    for (ix = 0; uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(a), ix < uVar2;
        ix = ix + 6) {
      for (local_a0 = 0; local_a0 < 6; local_a0 = local_a0 + 1) {
        for (ssim._4_4_ = 0; ssim._4_4_ < 6; ssim._4_4_ = ssim._4_4_ + 1) {
          if (channel_index < 0) {
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                               (a,ix + ssim._4_4_,iy + local_a0);
            iVar3 = color_quad<unsigned_char,_int>::get_luma(pcVar4);
            local_58[ssim._4_4_ + local_a0 * 6] = (uint8)iVar3;
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                               (b,ix + ssim._4_4_,iy + local_a0);
            iVar3 = color_quad<unsigned_char,_int>::get_luma(pcVar4);
            sy[(ulong)(ssim._4_4_ + local_a0 * 6) - 8] = (uint8)iVar3;
          }
          else {
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                               (a,ix + ssim._4_4_,iy + local_a0);
            uVar1 = color_quad<unsigned_char,_int>::operator[](pcVar4,channel_index);
            local_58[ssim._4_4_ + local_a0 * 6] = uVar1;
            pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                               (b,ix + ssim._4_4_,iy + local_a0);
            uVar1 = color_quad<unsigned_char,_int>::operator[](pcVar4,channel_index);
            sy[(ulong)(ssim._4_4_ + local_a0 * 6) - 8] = uVar1;
          }
        }
      }
      dVar5 = compute_block_ssim(0x24,local_58,(uint8 *)&total_ssim);
      _y = dVar5 + _y;
      x = x + 1;
    }
  }
  if (x == 0) {
    a_local = (image_u8 *)0x0;
  }
  else {
    a_local = (image_u8 *)(_y / (double)x);
  }
  return (double)a_local;
}

Assistant:

double compute_ssim(const image_u8& a, const image_u8& b, int channel_index)
        {
            const uint N = 6;
            uint8 sx[N * N], sy[N * N];

            double total_ssim = 0.0f;
            uint total_blocks = 0;

            //image_u8 yimg((a.get_width() + N - 1) / N, (a.get_height() + N - 1) / N);

            for (uint y = 0; y < a.get_height(); y += N)
            {
                for (uint x = 0; x < a.get_width(); x += N)
                {
                    for (uint iy = 0; iy < N; iy++)
                    {
                        for (uint ix = 0; ix < N; ix++)
                        {
                            if (channel_index < 0)
                            {
                                sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy).get_luma();
                            }
                            else
                            {
                                sx[ix + iy * N] = (uint8)a.get_clamped(x + ix, y + iy)[channel_index];
                            }

                            if (channel_index < 0)
                            {
                                sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy).get_luma();
                            }
                            else
                            {
                                sy[ix + iy * N] = (uint8)b.get_clamped(x + ix, y + iy)[channel_index];
                            }
                        }
                    }

                    double ssim = compute_block_ssim(N * N, sx, sy);
                    total_ssim += ssim;
                    total_blocks++;

                    //uint ssim_c = (uint)math::clamp<double>(ssim * 127.0f + 128.0f, 0, 255);
                    //yimg(x / N, y / N).set(ssim_c, ssim_c, ssim_c, 255);
                }
            }

            if (!total_blocks)
            {
                return 0.0f;
            }

            //save_to_file_stb_or_miniz("ssim.tga", yimg, cWriteFlagGrayscale);

            return total_ssim / total_blocks;
        }